

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O2

bool __thiscall
wallet::DatabaseBatch::Write<std::__cxx11::string,unsigned_long>
          (DatabaseBatch *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          unsigned_long *value,bool fOverwrite)

{
  int iVar1;
  long in_FS_OFFSET;
  DataStream local_68;
  DataStream local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_read_pos = 0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::reserve(&local_48,1000);
  Serialize<DataStream,char>(&local_48,key);
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_read_pos = 0;
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::reserve(&local_68,10000);
  DataStream::operator<<(&local_68,value);
  iVar1 = (*this->_vptr_DatabaseBatch[1])(this,&local_48,&local_68,(ulong)fOverwrite);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_68);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Write(const K& key, const T& value, bool fOverwrite = true)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        DataStream ssValue{};
        ssValue.reserve(10000);
        ssValue << value;

        return WriteKey(std::move(ssKey), std::move(ssValue), fOverwrite);
    }